

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar2;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pFVar2 = (((this->left_->fadexpr_).left_)->fadexpr_).right_;
  return (((this->right_->fadexpr_).right_)->dx_).ptr_to_data[i] *
         (this->right_->fadexpr_).left_.constant_ +
         (((pFVar1->fadexpr_).right_)->dx_).ptr_to_data[i] * (pFVar1->fadexpr_).left_.constant_ +
         (((pFVar2->fadexpr_).right_)->dx_).ptr_to_data[i] * (pFVar2->fadexpr_).left_.constant_;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}